

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_image(nk_command_buffer *b,nk_rect r,nk_image *img,nk_color col)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  void *pvVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar8 = r.w;
  fVar9 = r.h;
  fVar6 = r.x;
  fVar7 = r.y;
  if (b == (nk_command_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x2350,
                  "void nk_draw_image(struct nk_command_buffer *, struct nk_rect, const struct nk_image *, struct nk_color)"
                 );
  }
  if (b->use_clipping != 0) {
    fVar1 = (b->clip).w;
    if ((fVar1 == 0.0) && (!NAN(fVar1))) {
      return;
    }
    fVar2 = (b->clip).h;
    if ((fVar2 == 0.0) && (!NAN(fVar2))) {
      return;
    }
    fVar3 = (b->clip).x;
    if (fVar6 + fVar8 < fVar3) {
      return;
    }
    if (fVar1 + fVar3 < fVar6) {
      return;
    }
    fVar1 = (b->clip).y;
    if (fVar7 + fVar9 < fVar1) {
      return;
    }
    if (fVar2 + fVar1 < fVar7) {
      return;
    }
  }
  pvVar5 = nk_command_buffer_push(b,NK_COMMAND_IMAGE,0x38);
  if (pvVar5 != (void *)0x0) {
    *(short *)((long)pvVar5 + 0x10) = (short)(int)fVar6;
    if (fVar8 <= 0.0) {
      fVar8 = 0.0;
    }
    *(short *)((long)pvVar5 + 0x12) = (short)(int)fVar7;
    *(short *)((long)pvVar5 + 0x14) = (short)(int)fVar8;
    if (fVar9 <= 0.0) {
      fVar9 = 0.0;
    }
    *(short *)((long)pvVar5 + 0x16) = (short)(int)fVar9;
    uVar4 = *(undefined8 *)&img->w;
    *(nk_handle *)((long)pvVar5 + 0x18) = img->handle;
    *(undefined8 *)((long)pvVar5 + 0x20) = uVar4;
    *(undefined8 *)((long)pvVar5 + 0x28) = *(undefined8 *)(img->region + 2);
    *(nk_color *)((long)pvVar5 + 0x30) = col;
  }
  return;
}

Assistant:

NK_API void
nk_draw_image(struct nk_command_buffer *b, struct nk_rect r,
    const struct nk_image *img, struct nk_color col)
{
    struct nk_command_image *cmd;
    NK_ASSERT(b);
    if (!b) return;
    if (b->use_clipping) {
        const struct nk_rect *c = &b->clip;
        if (c->w == 0 || c->h == 0 || !NK_INTERSECT(r.x, r.y, r.w, r.h, c->x, c->y, c->w, c->h))
            return;
    }

    cmd = (struct nk_command_image*)
        nk_command_buffer_push(b, NK_COMMAND_IMAGE, sizeof(*cmd));
    if (!cmd) return;
    cmd->x = (short)r.x;
    cmd->y = (short)r.y;
    cmd->w = (unsigned short)NK_MAX(0, r.w);
    cmd->h = (unsigned short)NK_MAX(0, r.h);
    cmd->img = *img;
    cmd->col = col;
}